

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExport.cpp
# Opt level: O0

bool __thiscall
ODDLParser::OpenDDLExport::writeValue(OpenDDLExport *this,Value *val,string *statement)

{
  double dVar1;
  bool bVar2;
  int8 iVar3;
  byte bVar4;
  int16 iVar5;
  uint16 uVar6;
  int64 iVar7;
  uint64 uVar8;
  char *pcVar9;
  float fVar10;
  string local_1478 [32];
  stringstream local_1458 [8];
  stringstream stream_10;
  ostream local_1448 [376];
  string local_12d0 [32];
  stringstream local_12b0 [8];
  stringstream stream_9;
  undefined1 local_12a0 [376];
  string local_1128 [32];
  stringstream local_1108 [8];
  stringstream stream_8;
  undefined1 local_10f8 [376];
  string local_f80 [36];
  int local_f5c;
  stringstream local_f58 [4];
  int i_6;
  stringstream stream_7;
  undefined1 local_f48 [376];
  string local_dd0 [36];
  uint32 local_dac;
  stringstream local_da8 [4];
  int i_5;
  stringstream stream_6;
  undefined1 local_d98 [376];
  string local_c20 [36];
  uint local_bfc;
  stringstream local_bf8 [4];
  int i_4;
  stringstream stream_5;
  undefined1 local_be8 [376];
  string local_a70 [36];
  uint local_a4c;
  stringstream local_a48 [4];
  int i_3;
  stringstream stream_4;
  undefined1 local_a38 [376];
  string local_8c0 [36];
  int local_89c;
  stringstream local_898 [4];
  int i_2;
  stringstream stream_3;
  undefined1 local_888 [380];
  uint local_70c;
  char acStack_708 [4];
  int i_1;
  char buffer_1 [256];
  stringstream local_600 [8];
  stringstream stream_2;
  char acStack_478 [8];
  char buffer [256];
  stringstream local_370 [8];
  stringstream stream_1;
  string local_1e8 [52];
  int local_1b4;
  stringstream local_1b0 [4];
  int i;
  stringstream stream;
  undefined1 local_1a0 [376];
  string *local_28;
  string *statement_local;
  Value *val_local;
  OpenDDLExport *this_local;
  
  if (val == (Value *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_28 = statement;
    statement_local = (string *)val;
    val_local = (Value *)this;
    switch(val->m_type) {
    case ddl_bool:
      bVar2 = Value::getBool(val);
      if (bVar2) {
        std::__cxx11::string::operator+=((string *)local_28,"true");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_28,"false");
      }
      break;
    case ddl_int8:
      std::__cxx11::stringstream::stringstream(local_1b0);
      iVar3 = Value::getInt8((Value *)statement_local);
      local_1b4 = (int)iVar3;
      std::ostream::operator<<(local_1a0,local_1b4);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)local_28,local_1e8);
      std::__cxx11::string::~string(local_1e8);
      std::__cxx11::stringstream::~stringstream(local_1b0);
      break;
    case ddl_int16:
      std::__cxx11::stringstream::stringstream(local_370);
      buffer[0xe8] = '\0';
      buffer[0xe9] = '\0';
      buffer[0xea] = '\0';
      buffer[0xeb] = '\0';
      buffer[0xec] = '\0';
      buffer[0xed] = '\0';
      buffer[0xee] = '\0';
      buffer[0xef] = '\0';
      buffer[0xf0] = '\0';
      buffer[0xf1] = '\0';
      buffer[0xf2] = '\0';
      buffer[0xf3] = '\0';
      buffer[0xf4] = '\0';
      buffer[0xf5] = '\0';
      buffer[0xf6] = '\0';
      buffer[0xf7] = '\0';
      buffer[0xd8] = '\0';
      buffer[0xd9] = '\0';
      buffer[0xda] = '\0';
      buffer[0xdb] = '\0';
      buffer[0xdc] = '\0';
      buffer[0xdd] = '\0';
      buffer[0xde] = '\0';
      buffer[0xdf] = '\0';
      buffer[0xe0] = '\0';
      buffer[0xe1] = '\0';
      buffer[0xe2] = '\0';
      buffer[0xe3] = '\0';
      buffer[0xe4] = '\0';
      buffer[0xe5] = '\0';
      buffer[0xe6] = '\0';
      buffer[0xe7] = '\0';
      buffer[200] = '\0';
      buffer[0xc9] = '\0';
      buffer[0xca] = '\0';
      buffer[0xcb] = '\0';
      buffer[0xcc] = '\0';
      buffer[0xcd] = '\0';
      buffer[0xce] = '\0';
      buffer[0xcf] = '\0';
      buffer[0xd0] = '\0';
      buffer[0xd1] = '\0';
      buffer[0xd2] = '\0';
      buffer[0xd3] = '\0';
      buffer[0xd4] = '\0';
      buffer[0xd5] = '\0';
      buffer[0xd6] = '\0';
      buffer[0xd7] = '\0';
      buffer[0xb8] = '\0';
      buffer[0xb9] = '\0';
      buffer[0xba] = '\0';
      buffer[0xbb] = '\0';
      buffer[0xbc] = '\0';
      buffer[0xbd] = '\0';
      buffer[0xbe] = '\0';
      buffer[0xbf] = '\0';
      buffer[0xc0] = '\0';
      buffer[0xc1] = '\0';
      buffer[0xc2] = '\0';
      buffer[0xc3] = '\0';
      buffer[0xc4] = '\0';
      buffer[0xc5] = '\0';
      buffer[0xc6] = '\0';
      buffer[199] = '\0';
      buffer[0xa8] = '\0';
      buffer[0xa9] = '\0';
      buffer[0xaa] = '\0';
      buffer[0xab] = '\0';
      buffer[0xac] = '\0';
      buffer[0xad] = '\0';
      buffer[0xae] = '\0';
      buffer[0xaf] = '\0';
      buffer[0xb0] = '\0';
      buffer[0xb1] = '\0';
      buffer[0xb2] = '\0';
      buffer[0xb3] = '\0';
      buffer[0xb4] = '\0';
      buffer[0xb5] = '\0';
      buffer[0xb6] = '\0';
      buffer[0xb7] = '\0';
      buffer[0x98] = '\0';
      buffer[0x99] = '\0';
      buffer[0x9a] = '\0';
      buffer[0x9b] = '\0';
      buffer[0x9c] = '\0';
      buffer[0x9d] = '\0';
      buffer[0x9e] = '\0';
      buffer[0x9f] = '\0';
      buffer[0xa0] = '\0';
      buffer[0xa1] = '\0';
      buffer[0xa2] = '\0';
      buffer[0xa3] = '\0';
      buffer[0xa4] = '\0';
      buffer[0xa5] = '\0';
      buffer[0xa6] = '\0';
      buffer[0xa7] = '\0';
      buffer[0x88] = '\0';
      buffer[0x89] = '\0';
      buffer[0x8a] = '\0';
      buffer[0x8b] = '\0';
      buffer[0x8c] = '\0';
      buffer[0x8d] = '\0';
      buffer[0x8e] = '\0';
      buffer[0x8f] = '\0';
      buffer[0x90] = '\0';
      buffer[0x91] = '\0';
      buffer[0x92] = '\0';
      buffer[0x93] = '\0';
      buffer[0x94] = '\0';
      buffer[0x95] = '\0';
      buffer[0x96] = '\0';
      buffer[0x97] = '\0';
      buffer[0x78] = '\0';
      buffer[0x79] = '\0';
      buffer[0x7a] = '\0';
      buffer[0x7b] = '\0';
      buffer[0x7c] = '\0';
      buffer[0x7d] = '\0';
      buffer[0x7e] = '\0';
      buffer[0x7f] = '\0';
      buffer[0x80] = '\0';
      buffer[0x81] = '\0';
      buffer[0x82] = '\0';
      buffer[0x83] = '\0';
      buffer[0x84] = '\0';
      buffer[0x85] = '\0';
      buffer[0x86] = '\0';
      buffer[0x87] = '\0';
      buffer[0x68] = '\0';
      buffer[0x69] = '\0';
      buffer[0x6a] = '\0';
      buffer[0x6b] = '\0';
      buffer[0x6c] = '\0';
      buffer[0x6d] = '\0';
      buffer[0x6e] = '\0';
      buffer[0x6f] = '\0';
      buffer[0x70] = '\0';
      buffer[0x71] = '\0';
      buffer[0x72] = '\0';
      buffer[0x73] = '\0';
      buffer[0x74] = '\0';
      buffer[0x75] = '\0';
      buffer[0x76] = '\0';
      buffer[0x77] = '\0';
      buffer[0x58] = '\0';
      buffer[0x59] = '\0';
      buffer[0x5a] = '\0';
      buffer[0x5b] = '\0';
      buffer[0x5c] = '\0';
      buffer[0x5d] = '\0';
      buffer[0x5e] = '\0';
      buffer[0x5f] = '\0';
      buffer[0x60] = '\0';
      buffer[0x61] = '\0';
      buffer[0x62] = '\0';
      buffer[99] = '\0';
      buffer[100] = '\0';
      buffer[0x65] = '\0';
      buffer[0x66] = '\0';
      buffer[0x67] = '\0';
      buffer[0x48] = '\0';
      buffer[0x49] = '\0';
      buffer[0x4a] = '\0';
      buffer[0x4b] = '\0';
      buffer[0x4c] = '\0';
      buffer[0x4d] = '\0';
      buffer[0x4e] = '\0';
      buffer[0x4f] = '\0';
      buffer[0x50] = '\0';
      buffer[0x51] = '\0';
      buffer[0x52] = '\0';
      buffer[0x53] = '\0';
      buffer[0x54] = '\0';
      buffer[0x55] = '\0';
      buffer[0x56] = '\0';
      buffer[0x57] = '\0';
      buffer[0x38] = '\0';
      buffer[0x39] = '\0';
      buffer[0x3a] = '\0';
      buffer[0x3b] = '\0';
      buffer[0x3c] = '\0';
      buffer[0x3d] = '\0';
      buffer[0x3e] = '\0';
      buffer[0x3f] = '\0';
      buffer[0x40] = '\0';
      buffer[0x41] = '\0';
      buffer[0x42] = '\0';
      buffer[0x43] = '\0';
      buffer[0x44] = '\0';
      buffer[0x45] = '\0';
      buffer[0x46] = '\0';
      buffer[0x47] = '\0';
      buffer[0x28] = '\0';
      buffer[0x29] = '\0';
      buffer[0x2a] = '\0';
      buffer[0x2b] = '\0';
      buffer[0x2c] = '\0';
      buffer[0x2d] = '\0';
      buffer[0x2e] = '\0';
      buffer[0x2f] = '\0';
      buffer[0x30] = '\0';
      buffer[0x31] = '\0';
      buffer[0x32] = '\0';
      buffer[0x33] = '\0';
      buffer[0x34] = '\0';
      buffer[0x35] = '\0';
      buffer[0x36] = '\0';
      buffer[0x37] = '\0';
      buffer[0x18] = '\0';
      buffer[0x19] = '\0';
      buffer[0x1a] = '\0';
      buffer[0x1b] = '\0';
      buffer[0x1c] = '\0';
      buffer[0x1d] = '\0';
      buffer[0x1e] = '\0';
      buffer[0x1f] = '\0';
      buffer[0x20] = '\0';
      buffer[0x21] = '\0';
      buffer[0x22] = '\0';
      buffer[0x23] = '\0';
      buffer[0x24] = '\0';
      buffer[0x25] = '\0';
      buffer[0x26] = '\0';
      buffer[0x27] = '\0';
      buffer[8] = '\0';
      buffer[9] = '\0';
      buffer[10] = '\0';
      buffer[0xb] = '\0';
      buffer[0xc] = '\0';
      buffer[0xd] = '\0';
      buffer[0xe] = '\0';
      buffer[0xf] = '\0';
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      acStack_478[0] = '\0';
      acStack_478[1] = '\0';
      acStack_478[2] = '\0';
      acStack_478[3] = '\0';
      acStack_478[4] = '\0';
      acStack_478[5] = '\0';
      acStack_478[6] = '\0';
      acStack_478[7] = '\0';
      buffer[0] = '\0';
      buffer[1] = '\0';
      buffer[2] = '\0';
      buffer[3] = '\0';
      buffer[4] = '\0';
      buffer[5] = '\0';
      buffer[6] = '\0';
      buffer[7] = '\0';
      iVar5 = Value::getInt16((Value *)statement_local);
      sprintf(acStack_478,"%d",(ulong)(uint)(int)iVar5);
      std::__cxx11::string::operator+=((string *)local_28,acStack_478);
      std::__cxx11::stringstream::~stringstream(local_370);
      break;
    case ddl_int32:
      std::__cxx11::stringstream::stringstream(local_600);
      buffer_1[0xe8] = '\0';
      buffer_1[0xe9] = '\0';
      buffer_1[0xea] = '\0';
      buffer_1[0xeb] = '\0';
      buffer_1[0xec] = '\0';
      buffer_1[0xed] = '\0';
      buffer_1[0xee] = '\0';
      buffer_1[0xef] = '\0';
      buffer_1[0xf0] = '\0';
      buffer_1[0xf1] = '\0';
      buffer_1[0xf2] = '\0';
      buffer_1[0xf3] = '\0';
      buffer_1[0xf4] = '\0';
      buffer_1[0xf5] = '\0';
      buffer_1[0xf6] = '\0';
      buffer_1[0xf7] = '\0';
      buffer_1[0xd8] = '\0';
      buffer_1[0xd9] = '\0';
      buffer_1[0xda] = '\0';
      buffer_1[0xdb] = '\0';
      buffer_1[0xdc] = '\0';
      buffer_1[0xdd] = '\0';
      buffer_1[0xde] = '\0';
      buffer_1[0xdf] = '\0';
      buffer_1[0xe0] = '\0';
      buffer_1[0xe1] = '\0';
      buffer_1[0xe2] = '\0';
      buffer_1[0xe3] = '\0';
      buffer_1[0xe4] = '\0';
      buffer_1[0xe5] = '\0';
      buffer_1[0xe6] = '\0';
      buffer_1[0xe7] = '\0';
      buffer_1[200] = '\0';
      buffer_1[0xc9] = '\0';
      buffer_1[0xca] = '\0';
      buffer_1[0xcb] = '\0';
      buffer_1[0xcc] = '\0';
      buffer_1[0xcd] = '\0';
      buffer_1[0xce] = '\0';
      buffer_1[0xcf] = '\0';
      buffer_1[0xd0] = '\0';
      buffer_1[0xd1] = '\0';
      buffer_1[0xd2] = '\0';
      buffer_1[0xd3] = '\0';
      buffer_1[0xd4] = '\0';
      buffer_1[0xd5] = '\0';
      buffer_1[0xd6] = '\0';
      buffer_1[0xd7] = '\0';
      buffer_1[0xb8] = '\0';
      buffer_1[0xb9] = '\0';
      buffer_1[0xba] = '\0';
      buffer_1[0xbb] = '\0';
      buffer_1[0xbc] = '\0';
      buffer_1[0xbd] = '\0';
      buffer_1[0xbe] = '\0';
      buffer_1[0xbf] = '\0';
      buffer_1[0xc0] = '\0';
      buffer_1[0xc1] = '\0';
      buffer_1[0xc2] = '\0';
      buffer_1[0xc3] = '\0';
      buffer_1[0xc4] = '\0';
      buffer_1[0xc5] = '\0';
      buffer_1[0xc6] = '\0';
      buffer_1[199] = '\0';
      buffer_1[0xa8] = '\0';
      buffer_1[0xa9] = '\0';
      buffer_1[0xaa] = '\0';
      buffer_1[0xab] = '\0';
      buffer_1[0xac] = '\0';
      buffer_1[0xad] = '\0';
      buffer_1[0xae] = '\0';
      buffer_1[0xaf] = '\0';
      buffer_1[0xb0] = '\0';
      buffer_1[0xb1] = '\0';
      buffer_1[0xb2] = '\0';
      buffer_1[0xb3] = '\0';
      buffer_1[0xb4] = '\0';
      buffer_1[0xb5] = '\0';
      buffer_1[0xb6] = '\0';
      buffer_1[0xb7] = '\0';
      buffer_1[0x98] = '\0';
      buffer_1[0x99] = '\0';
      buffer_1[0x9a] = '\0';
      buffer_1[0x9b] = '\0';
      buffer_1[0x9c] = '\0';
      buffer_1[0x9d] = '\0';
      buffer_1[0x9e] = '\0';
      buffer_1[0x9f] = '\0';
      buffer_1[0xa0] = '\0';
      buffer_1[0xa1] = '\0';
      buffer_1[0xa2] = '\0';
      buffer_1[0xa3] = '\0';
      buffer_1[0xa4] = '\0';
      buffer_1[0xa5] = '\0';
      buffer_1[0xa6] = '\0';
      buffer_1[0xa7] = '\0';
      buffer_1[0x88] = '\0';
      buffer_1[0x89] = '\0';
      buffer_1[0x8a] = '\0';
      buffer_1[0x8b] = '\0';
      buffer_1[0x8c] = '\0';
      buffer_1[0x8d] = '\0';
      buffer_1[0x8e] = '\0';
      buffer_1[0x8f] = '\0';
      buffer_1[0x90] = '\0';
      buffer_1[0x91] = '\0';
      buffer_1[0x92] = '\0';
      buffer_1[0x93] = '\0';
      buffer_1[0x94] = '\0';
      buffer_1[0x95] = '\0';
      buffer_1[0x96] = '\0';
      buffer_1[0x97] = '\0';
      buffer_1[0x78] = '\0';
      buffer_1[0x79] = '\0';
      buffer_1[0x7a] = '\0';
      buffer_1[0x7b] = '\0';
      buffer_1[0x7c] = '\0';
      buffer_1[0x7d] = '\0';
      buffer_1[0x7e] = '\0';
      buffer_1[0x7f] = '\0';
      buffer_1[0x80] = '\0';
      buffer_1[0x81] = '\0';
      buffer_1[0x82] = '\0';
      buffer_1[0x83] = '\0';
      buffer_1[0x84] = '\0';
      buffer_1[0x85] = '\0';
      buffer_1[0x86] = '\0';
      buffer_1[0x87] = '\0';
      buffer_1[0x68] = '\0';
      buffer_1[0x69] = '\0';
      buffer_1[0x6a] = '\0';
      buffer_1[0x6b] = '\0';
      buffer_1[0x6c] = '\0';
      buffer_1[0x6d] = '\0';
      buffer_1[0x6e] = '\0';
      buffer_1[0x6f] = '\0';
      buffer_1[0x70] = '\0';
      buffer_1[0x71] = '\0';
      buffer_1[0x72] = '\0';
      buffer_1[0x73] = '\0';
      buffer_1[0x74] = '\0';
      buffer_1[0x75] = '\0';
      buffer_1[0x76] = '\0';
      buffer_1[0x77] = '\0';
      buffer_1[0x58] = '\0';
      buffer_1[0x59] = '\0';
      buffer_1[0x5a] = '\0';
      buffer_1[0x5b] = '\0';
      buffer_1[0x5c] = '\0';
      buffer_1[0x5d] = '\0';
      buffer_1[0x5e] = '\0';
      buffer_1[0x5f] = '\0';
      buffer_1[0x60] = '\0';
      buffer_1[0x61] = '\0';
      buffer_1[0x62] = '\0';
      buffer_1[99] = '\0';
      buffer_1[100] = '\0';
      buffer_1[0x65] = '\0';
      buffer_1[0x66] = '\0';
      buffer_1[0x67] = '\0';
      buffer_1[0x48] = '\0';
      buffer_1[0x49] = '\0';
      buffer_1[0x4a] = '\0';
      buffer_1[0x4b] = '\0';
      buffer_1[0x4c] = '\0';
      buffer_1[0x4d] = '\0';
      buffer_1[0x4e] = '\0';
      buffer_1[0x4f] = '\0';
      buffer_1[0x50] = '\0';
      buffer_1[0x51] = '\0';
      buffer_1[0x52] = '\0';
      buffer_1[0x53] = '\0';
      buffer_1[0x54] = '\0';
      buffer_1[0x55] = '\0';
      buffer_1[0x56] = '\0';
      buffer_1[0x57] = '\0';
      buffer_1[0x38] = '\0';
      buffer_1[0x39] = '\0';
      buffer_1[0x3a] = '\0';
      buffer_1[0x3b] = '\0';
      buffer_1[0x3c] = '\0';
      buffer_1[0x3d] = '\0';
      buffer_1[0x3e] = '\0';
      buffer_1[0x3f] = '\0';
      buffer_1[0x40] = '\0';
      buffer_1[0x41] = '\0';
      buffer_1[0x42] = '\0';
      buffer_1[0x43] = '\0';
      buffer_1[0x44] = '\0';
      buffer_1[0x45] = '\0';
      buffer_1[0x46] = '\0';
      buffer_1[0x47] = '\0';
      buffer_1[0x28] = '\0';
      buffer_1[0x29] = '\0';
      buffer_1[0x2a] = '\0';
      buffer_1[0x2b] = '\0';
      buffer_1[0x2c] = '\0';
      buffer_1[0x2d] = '\0';
      buffer_1[0x2e] = '\0';
      buffer_1[0x2f] = '\0';
      buffer_1[0x30] = '\0';
      buffer_1[0x31] = '\0';
      buffer_1[0x32] = '\0';
      buffer_1[0x33] = '\0';
      buffer_1[0x34] = '\0';
      buffer_1[0x35] = '\0';
      buffer_1[0x36] = '\0';
      buffer_1[0x37] = '\0';
      buffer_1[0x18] = '\0';
      buffer_1[0x19] = '\0';
      buffer_1[0x1a] = '\0';
      buffer_1[0x1b] = '\0';
      buffer_1[0x1c] = '\0';
      buffer_1[0x1d] = '\0';
      buffer_1[0x1e] = '\0';
      buffer_1[0x1f] = '\0';
      buffer_1[0x20] = '\0';
      buffer_1[0x21] = '\0';
      buffer_1[0x22] = '\0';
      buffer_1[0x23] = '\0';
      buffer_1[0x24] = '\0';
      buffer_1[0x25] = '\0';
      buffer_1[0x26] = '\0';
      buffer_1[0x27] = '\0';
      buffer_1[8] = '\0';
      buffer_1[9] = '\0';
      buffer_1[10] = '\0';
      buffer_1[0xb] = '\0';
      buffer_1[0xc] = '\0';
      buffer_1[0xd] = '\0';
      buffer_1[0xe] = '\0';
      buffer_1[0xf] = '\0';
      buffer_1[0x10] = '\0';
      buffer_1[0x11] = '\0';
      buffer_1[0x12] = '\0';
      buffer_1[0x13] = '\0';
      buffer_1[0x14] = '\0';
      buffer_1[0x15] = '\0';
      buffer_1[0x16] = '\0';
      buffer_1[0x17] = '\0';
      _acStack_708 = 0;
      buffer_1[0] = '\0';
      buffer_1[1] = '\0';
      buffer_1[2] = '\0';
      buffer_1[3] = '\0';
      buffer_1[4] = '\0';
      buffer_1[5] = '\0';
      buffer_1[6] = '\0';
      buffer_1[7] = '\0';
      local_70c = Value::getInt32((Value *)statement_local);
      sprintf(acStack_708,"%d",(ulong)local_70c);
      std::__cxx11::string::operator+=((string *)local_28,acStack_708);
      std::__cxx11::stringstream::~stringstream(local_600);
      break;
    case ddl_int64:
      std::__cxx11::stringstream::stringstream(local_898);
      iVar7 = Value::getInt64((Value *)statement_local);
      local_89c = (int)iVar7;
      std::ostream::operator<<(local_888,local_89c);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)local_28,local_8c0);
      std::__cxx11::string::~string(local_8c0);
      std::__cxx11::stringstream::~stringstream(local_898);
      break;
    case ddl_unsigned_int8:
      std::__cxx11::stringstream::stringstream(local_a48);
      bVar4 = Value::getUnsignedInt8((Value *)statement_local);
      local_a4c = (uint)bVar4;
      std::ostream::operator<<(local_a38,local_a4c);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)local_28,local_a70);
      std::__cxx11::string::~string(local_a70);
      std::__cxx11::stringstream::~stringstream(local_a48);
      break;
    case ddl_unsigned_int16:
      std::__cxx11::stringstream::stringstream(local_bf8);
      uVar6 = Value::getUnsignedInt16((Value *)statement_local);
      local_bfc = (uint)uVar6;
      std::ostream::operator<<(local_be8,local_bfc);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)local_28,local_c20);
      std::__cxx11::string::~string(local_c20);
      std::__cxx11::stringstream::~stringstream(local_bf8);
      break;
    case ddl_unsigned_int32:
      std::__cxx11::stringstream::stringstream(local_da8);
      local_dac = Value::getUnsignedInt32((Value *)statement_local);
      std::ostream::operator<<(local_d98,local_dac);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)local_28,local_dd0);
      std::__cxx11::string::~string(local_dd0);
      std::__cxx11::stringstream::~stringstream(local_da8);
      break;
    case ddl_unsigned_int64:
      std::__cxx11::stringstream::stringstream(local_f58);
      uVar8 = Value::getUnsignedInt64((Value *)statement_local);
      local_f5c = (int)uVar8;
      std::ostream::operator<<(local_f48,local_f5c);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)local_28,local_f80);
      std::__cxx11::string::~string(local_f80);
      std::__cxx11::stringstream::~stringstream(local_f58);
      break;
    case ddl_half:
      break;
    case ddl_float:
      std::__cxx11::stringstream::stringstream(local_1108);
      fVar10 = Value::getFloat((Value *)statement_local);
      std::ostream::operator<<(local_10f8,fVar10);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)local_28,local_1128);
      std::__cxx11::string::~string(local_1128);
      std::__cxx11::stringstream::~stringstream(local_1108);
      break;
    case ddl_double:
      std::__cxx11::stringstream::stringstream(local_12b0);
      dVar1 = Value::getDouble((Value *)statement_local);
      std::ostream::operator<<(local_12a0,dVar1);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)local_28,local_12d0);
      std::__cxx11::string::~string(local_12d0);
      std::__cxx11::stringstream::~stringstream(local_12b0);
      break;
    case ddl_string:
      std::__cxx11::stringstream::stringstream(local_1458);
      pcVar9 = Value::getString((Value *)statement_local);
      std::operator<<(local_1448,pcVar9);
      std::__cxx11::string::operator+=((string *)local_28,"\"");
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)local_28,local_1478);
      std::__cxx11::string::~string(local_1478);
      std::__cxx11::string::operator+=((string *)local_28,"\"");
      std::__cxx11::stringstream::~stringstream(local_1458);
      break;
    case ddl_ref:
      break;
    case ddl_none:
    case ddl_types_max:
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool OpenDDLExport::writeValue( Value *val, std::string &statement ) {
    if (ddl_nullptr == val) {
        return false;
    }

    switch ( val->m_type ) {
        case Value::ddl_bool:
            if ( true == val->getBool() ) {
                statement += "true";
            } else {
                statement += "false";
            }
            break;
        case Value::ddl_int8: 
            {
                std::stringstream stream;
                const int i = static_cast<int>( val->getInt8() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_int16:
            {
                std::stringstream stream;
                char buffer[ 256 ];
                ::memset( buffer, '\0', 256 * sizeof( char ) );
                sprintf( buffer, "%d", val->getInt16() );
                statement += buffer;
        }
            break;
        case Value::ddl_int32:
            {
                std::stringstream stream;
                char buffer[ 256 ];
                ::memset( buffer, '\0', 256 * sizeof( char ) );
                const int i = static_cast< int >( val->getInt32() );
                sprintf( buffer, "%d", i );
                statement += buffer;
            }
            break;
        case Value::ddl_int64:
            {
                std::stringstream stream;
                const int i = static_cast< int >( val->getInt64() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_unsigned_int8:
            {
                std::stringstream stream;
                const int i = static_cast< unsigned int >( val->getUnsignedInt8() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_unsigned_int16:
            {
                std::stringstream stream;
                const int i = static_cast< unsigned int >( val->getUnsignedInt16() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_unsigned_int32:
            {
                std::stringstream stream;
                const int i = static_cast< unsigned int >( val->getUnsignedInt32() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_unsigned_int64:
            {
                std::stringstream stream;
                const int i = static_cast< unsigned int >( val->getUnsignedInt64() );
                stream << i;
                statement += stream.str();
            }
            break;
        case Value::ddl_half:
            break;
        case Value::ddl_float:
            {
                std::stringstream stream;
                stream << val->getFloat();
                statement += stream.str();
            }
            break;
        case Value::ddl_double:
            {
                std::stringstream stream;
                stream << val->getDouble();
                statement += stream.str();
            }
            break;
        case Value::ddl_string:
            {
                std::stringstream stream;
                stream << val->getString();
                statement += "\"";
                statement += stream.str();
                statement += "\"";
             }
            break;
        case Value::ddl_ref:
            break;
        case Value::ddl_none:
        case Value::ddl_types_max:
        default:
            break;
    }

    return true;
}